

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,__1,_0,__1,__1> *a_lhs,
               Matrix<double,__1,__1,_0,__1,__1> *a_rhs,Scalar *alpha)

{
  double dVar1;
  Index IVar2;
  Index IVar3;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this;
  ExtractType rhs_00;
  Index IVar4;
  bool bVar5;
  Scalar SVar6;
  Scalar SVar7;
  gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
  local_1b0;
  undefined1 local_188 [8];
  BlockingType blocking;
  Scalar actualAlpha;
  type rhs;
  type lhs;
  undefined1 local_100 [8];
  RowXpr dst_vec_1;
  undefined1 local_90 [8];
  ColXpr dst_vec;
  Scalar *alpha_local;
  Matrix<double,__1,__1,_0,__1,__1> *a_rhs_local;
  Matrix<double,__1,__1,_0,__1,__1> *a_lhs_local;
  Matrix<double,__1,__1,_0,__1,__1> *dst_local;
  
  dst_vec.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_outerStride =
       (Index)alpha;
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  bVar5 = false;
  if (IVar2 == IVar3) {
    IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    bVar5 = IVar2 == IVar3;
  }
  if (bVar5) {
    IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    if (((IVar2 != 0) &&
        (IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                           (&a_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           ), IVar2 != 0)) &&
       (IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                          (&a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
       , IVar2 != 0)) {
      IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
      if (IVar2 == 1) {
        DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  ((ColXpr *)local_90,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst,0)
        ;
        DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  ((ConstColXpr *)
                   &dst_vec_1.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                    .m_outerStride,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)a_rhs,0);
        generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::DenseShape,Eigen::DenseShape,7>
        ::scaleAndAddTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_90,a_lhs,
                   (Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                   &dst_vec_1.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                    .m_outerStride,
                   (Scalar *)
                   dst_vec.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                   .m_outerStride);
      }
      else {
        IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                          (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
        if (IVar2 == 1) {
          DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                    ((RowXpr *)local_100,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst
                     ,0);
          DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                    ((ConstRowXpr *)&lhs,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)a_lhs,0);
          generic_product_impl<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,7>
          ::scaleAndAddTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_100,
                     (Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&lhs,
                     a_rhs,(Scalar *)
                           dst_vec.
                           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                           .m_outerStride);
        }
        else {
          this = &blas_traits<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::extract(a_lhs)->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
          rhs_00 = blas_traits<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::extract(a_rhs);
          dVar1 = *(double *)
                   dst_vec.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                   .m_outerStride;
          SVar6 = blas_traits<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::extractScalarFactor(a_lhs)
          ;
          SVar7 = blas_traits<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::extractScalarFactor(a_rhs)
          ;
          blocking.m_sizeB = (Index)(dVar1 * SVar6 * SVar7);
          IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                            (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          ;
          IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                            (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          ;
          IVar4 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(this);
          gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>::gemm_blocking_space
                    ((gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> *)local_188,IVar2
                     ,IVar3,IVar4,1,true);
          gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0,_1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>_>
          ::gemm_functor(&local_1b0,(Matrix<double,__1,__1,_0,__1,__1> *)this,rhs_00,dst,
                         (double *)&blocking.m_sizeB,
                         (gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> *)local_188);
          IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                            (&a_lhs->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
          IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                            (&a_rhs->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
          IVar4 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                            (&a_lhs->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
          parallelize_gemm<true,Eigen::internal::gemm_functor<double,long,Eigen::internal::general_matrix_matrix_product<long,double,0,false,double,0,false,0,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::gemm_blocking_space<0,double,double,_1,_1,_1,1,false>>,long>
                    (&local_1b0,IVar2,IVar3,IVar4,false);
          gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>::~gemm_blocking_space
                    ((gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> *)local_188);
        }
      }
    }
    return;
  }
  __assert_fail("dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/products/GeneralMatrixMatrix.h"
                ,0x1d6,
                "static void Eigen::internal::generic_product_impl<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, Eigen::DenseShape, Eigen::DenseShape, 8>::scaleAndAddTo(Dest &, const Lhs &, const Rhs &, const Scalar &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, LhsShape = Eigen::DenseShape, RhsShape = Eigen::DenseShape, ProductType = 8, Dest = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

static void scaleAndAddTo(Dest& dst, const Lhs& a_lhs, const Rhs& a_rhs, const Scalar& alpha)
  {
    eigen_assert(dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols());
    if(a_lhs.cols()==0 || a_lhs.rows()==0 || a_rhs.cols()==0)
      return;

    if (dst.cols() == 1)
    {
      // Fallback to GEMV if either the lhs or rhs is a runtime vector
      typename Dest::ColXpr dst_vec(dst.col(0));
      return internal::generic_product_impl<Lhs,typename Rhs::ConstColXpr,DenseShape,DenseShape,GemvProduct>
        ::scaleAndAddTo(dst_vec, a_lhs, a_rhs.col(0), alpha);
    }
    else if (dst.rows() == 1)
    {
      // Fallback to GEMV if either the lhs or rhs is a runtime vector
      typename Dest::RowXpr dst_vec(dst.row(0));
      return internal::generic_product_impl<typename Lhs::ConstRowXpr,Rhs,DenseShape,DenseShape,GemvProduct>
        ::scaleAndAddTo(dst_vec, a_lhs.row(0), a_rhs, alpha);
    }

    typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(a_lhs);
    typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(a_rhs);

    Scalar actualAlpha = combine_scalar_factors(alpha, a_lhs, a_rhs);

    typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,LhsScalar,RhsScalar,
            Dest::MaxRowsAtCompileTime,Dest::MaxColsAtCompileTime,MaxDepthAtCompileTime> BlockingType;

    typedef internal::gemm_functor<
      Scalar, Index,
      internal::general_matrix_matrix_product<
        Index,
        LhsScalar, (ActualLhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(LhsBlasTraits::NeedToConjugate),
        RhsScalar, (ActualRhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(RhsBlasTraits::NeedToConjugate),
        (Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,
        Dest::InnerStrideAtCompileTime>,
      ActualLhsTypeCleaned, ActualRhsTypeCleaned, Dest, BlockingType> GemmFunctor;

    BlockingType blocking(dst.rows(), dst.cols(), lhs.cols(), 1, true);
    internal::parallelize_gemm<(Dest::MaxRowsAtCompileTime>32 || Dest::MaxRowsAtCompileTime==Dynamic)>
        (GemmFunctor(lhs, rhs, dst, actualAlpha, blocking), a_lhs.rows(), a_rhs.cols(), a_lhs.cols(), Dest::Flags&RowMajorBit);
  }